

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_interaction.cpp
# Opt level: O0

void __thiscall AActor::Die(AActor *this,AActor *source,AActor *inflictor,int dmgflags)

{
  int iVar1;
  DBaseStatusBar *pDVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  FState *pFVar9;
  MetaClass *pMVar10;
  long lVar11;
  char *killer;
  char *pcVar12;
  char *pcVar13;
  char *pcVar14;
  DHUDMessageFadeOut *pDVar15;
  DBot *pDVar16;
  AActor *pAVar17;
  DBot *pDVar18;
  char **ppcVar19;
  double dVar20;
  bool local_433;
  byte local_432;
  byte local_431;
  FName local_420;
  FName local_41c;
  FName local_418;
  FName local_414;
  TFlags<ActorFlag3,_unsigned_int> local_410;
  TFlags<ActorFlag4,_unsigned_int> local_40c;
  FName local_408;
  FName local_404;
  FName local_400;
  FName FStack_3fc;
  FName labels [3];
  TFlags<ActorFlag4,_unsigned_int> local_3e8;
  int iStack_3e4;
  bool extremelydead;
  ActorFlags4 iflags4;
  int gibhealth;
  FState *diestate;
  Self local_3d0;
  int local_3cc;
  char local_3c8 [4];
  int i;
  char buff_2 [256];
  char *local_2c0;
  char *multimsg;
  char buff_1 [256];
  char *local_1b0;
  char *spreemsg;
  char local_198 [8];
  char buff [256];
  TFlags<ActorFlag3,_unsigned_int> local_90;
  TFlags<ActorFlag,_unsigned_int> local_8c;
  double local_88;
  double metaheight;
  FName local_78;
  TFlags<ActorFlag3,_unsigned_int> local_74;
  Self local_70;
  TFlags<ActorFlag4,_unsigned_int> local_6c;
  undefined1 local_68 [4];
  TFlags<ActorFlag,_unsigned_int> local_64;
  TFlags<ActorFlag,_unsigned_int> local_60;
  TFlags<ActorFlag7,_unsigned_int> local_5c;
  TFlags<ActorFlag7,_unsigned_int> local_58;
  TFlags<ActorFlag,_unsigned_int> local_54;
  AInventory *local_50;
  AInventory *next;
  AInventory *item;
  int pnum;
  int realgibhealth;
  int realhealth;
  int realstyle;
  AActor *realthis;
  bool wasgibbed;
  AActor *pAStack_20;
  int dmgflags_local;
  AActor *inflictor_local;
  AActor *source_local;
  AActor *this_local;
  
  iVar1 = this->health;
  realthis._4_4_ = dmgflags;
  pAStack_20 = inflictor;
  inflictor_local = source;
  source_local = this;
  iVar5 = GetGibHealth(this);
  realthis._3_1_ = iVar1 < iVar5;
  _realhealth = (AActor *)0x0;
  realgibhealth = 0;
  pnum = 0;
  bVar3 = P_MorphedDeath(this,(AActor **)&realhealth,&realgibhealth,&pnum);
  if (bVar3) {
    if ((realgibhealth & 0x800U) != 0) {
      return;
    }
    if (((realthis._3_1_ & 1) != 0) &&
       (item._4_4_ = GetGibHealth(_realhealth), item._4_4_ <= _realhealth->health)) {
      _realhealth->health = item._4_4_ + -1;
    }
    CallDie(_realhealth,inflictor_local,pAStack_20,realthis._4_4_);
    return;
  }
  this->effects = this->effects & 0xffffffdf;
  if ((debugfile != (FILE *)0x0) && (this->player != (player_t *)0x0)) {
    uVar8 = (long)(this->player[-0xa3fb].weapons.Slots + 4) / 0x2a0;
    item._0_4_ = (int)uVar8;
    Die::dieticks[(int)item] = gametic;
    fprintf((FILE *)debugfile,"died (%d) on tic %d (%s)\n",uVar8 & 0xffffffff,(ulong)(uint)gametic);
  }
  next = ::TObjPtr::operator_cast_to_AInventory_((TObjPtr *)&this->Inventory);
  while (next != (AInventory *)0x0) {
    local_50 = ::TObjPtr::operator_cast_to_AInventory_((TObjPtr *)&(next->super_AActor).Inventory);
    (*(next->super_AActor).super_DThinker.super_DObject._vptr_DObject[0x30])();
    next = local_50;
  }
  iVar1 = (int)this;
  TFlags<ActorFlag,_unsigned_int>::operator&
            (&local_54,
             iVar1 + (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|
                     MF_SHOOTABLE));
  uVar6 = ::TFlags::operator_cast_to_unsigned_int((TFlags *)&local_54);
  if (uVar6 != 0) {
    P_ExplodeMissile(this,(line_t_conflict *)0x0,(AActor *)0x0);
    return;
  }
  if (inflictor_local != (AActor *)0x0) {
    TObjPtr<AActor>::operator=(&this->target,inflictor_local);
  }
  local_431 = 0;
  if (this->player == (player_t *)0x0) {
    TFlags<ActorFlag7,_unsigned_int>::operator&
              (&local_58,
               iVar1 + (MF7_DONTTHRUST|MF7_FOILBUDDHA|MF7_BUDDHA|MF7_WEAPONSPAWN|MF7_ALWAYSTELEFRAG)
              );
    uVar6 = ::TFlags::operator_cast_to_unsigned_int((TFlags *)&local_58);
    local_431 = 0;
    if (uVar6 == 0) {
      TFlags<ActorFlag7,_unsigned_int>::operator&
                (&local_5c,
                 iVar1 + (MF7_DONTTHRUST|MF7_FOILBUDDHA|MF7_BUDDHA|MF7_WEAPONSPAWN|
                         MF7_ALWAYSTELEFRAG));
      uVar6 = ::TFlags::operator_cast_to_unsigned_int((TFlags *)&local_5c);
      local_432 = 1;
      if (uVar6 == 0) {
        local_432 = gameinfo.forcekillscripts;
      }
      local_431 = local_432;
    }
  }
  if ((local_431 & 1) != 0) {
    FBehavior::StaticStartTypedScripts(0x11,this,true,0,true);
  }
  ::operator|((EnumType)local_68,MF_SHOOTABLE);
  TFlags<ActorFlag,_unsigned_int>::operator|(&local_64,(ActorFlag)local_68);
  TFlags<ActorFlag,_unsigned_int>::operator~(&local_60);
  TFlags<ActorFlag,_unsigned_int>::operator&=(&this->flags,&local_60);
  TFlags<ActorFlag4,_unsigned_int>::operator&
            (&local_6c,iVar1 + (MF4_STRIFEDAMAGE|MF4_ACTLIKEBRIDGE|MF4_FIXMAPTHINGPOS|MF4_BOSSDEATH)
            );
  uVar6 = ::TFlags::operator_cast_to_unsigned_int((TFlags *)&local_6c);
  if (uVar6 == 0) {
    operator~((EnumType)&local_70);
    TFlags<ActorFlag,_unsigned_int>::operator&=(&this->flags,&local_70);
  }
  TFlags<ActorFlag,_unsigned_int>::operator|=(&this->flags,MF_DROPOFF);
  TFlags<ActorFlag3,_unsigned_int>::operator&
            (&local_74,iVar1 + (MF3_DONTOVERLAP|MF3_NOSIGHTCHECK|MF3_DONTSPLASH|MF3_NORADIUSDMG));
  uVar6 = ::TFlags::operator_cast_to_unsigned_int((TFlags *)&local_74);
  local_433 = true;
  if (uVar6 == 0) {
    FName::FName(&local_78,NAME_Raise);
    pFVar9 = FindState(this,&local_78);
    local_433 = true;
    if (pFVar9 == (FState *)0x0) {
      local_433 = DObject::IsKindOf((DObject *)this,APlayerPawn::RegistrationInfo.MyClass);
    }
  }
  if (local_433 != false) {
    TFlags<ActorFlag6,_unsigned_int>::operator&
              ((TFlags<ActorFlag6,_unsigned_int> *)((long)&metaheight + 4),
               iVar1 + (MF6_NOTELEFRAG|MF6_STEPMISSILE|MF6_DONTHARMSPECIES|MF6_NOFEAR));
    uVar6 = ::TFlags::operator_cast_to_unsigned_int((TFlags *)((long)&metaheight + 4));
    if (uVar6 == 0) {
      TFlags<ActorFlag,_unsigned_int>::operator|=(&this->flags,MF_CORPSE);
    }
  }
  TFlags<ActorFlag6,_unsigned_int>::operator|=(&this->flags6,MF6_KILLED);
  local_88 = -1.0;
  bVar3 = FName::operator==(&(this->DamageType).super_FName,NAME_Fire);
  if (bVar3) {
    pMVar10 = GetClass(this);
    local_88 = pMVar10->BurnHeight;
  }
  if (local_88 < 0.0) {
    pMVar10 = GetClass(this);
    local_88 = pMVar10->DeathHeight;
  }
  if (0.0 <= local_88) {
    dVar20 = MAX<double>(local_88,0.0);
    this->Height = dVar20;
  }
  else {
    this->Height = this->Height * 0.25;
  }
  bVar3 = false;
  if (this->special != 0) {
    TFlags<ActorFlag,_unsigned_int>::operator&
              (&local_8c,
               iVar1 + (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|
                       MF_SHOOTABLE));
    uVar6 = ::TFlags::operator_cast_to_unsigned_int((TFlags *)&local_8c);
    if (uVar6 != 0) {
      TFlags<ActorFlag3,_unsigned_int>::operator&
                (&local_90,iVar1 + (MF3_DONTOVERLAP|MF3_NOSIGHTCHECK|MF3_DONTSPLASH|MF3_NORADIUSDMG)
                );
      uVar6 = ::TFlags::operator_cast_to_unsigned_int((TFlags *)&local_90);
      bVar3 = false;
      if (uVar6 == 0) goto LAB_00565213;
    }
    bVar3 = (this->activationtype & 0x40U) == 0;
  }
LAB_00565213:
  if (bVar3) {
    P_ActivateThingSpecial(this,inflictor_local,true);
  }
  bVar3 = CountsAsKill(this);
  if (bVar3) {
    ::level.killed_monsters = ::level.killed_monsters + 1;
  }
  if ((inflictor_local == (AActor *)0x0) || (inflictor_local->player == (player_t *)0x0)) {
    if (((multiplayer & 1U) == 0) && (bVar3 = CountsAsKill(this), bVar3)) {
      DAT_01ae71b8 = DAT_01ae71b8 + 1;
    }
  }
  else {
    bVar3 = CountsAsKill(this);
    if (bVar3) {
      inflictor_local->player->killcount = inflictor_local->player->killcount + 1;
    }
    if ((this->player != (player_t *)0x0) && (::level.maptime != 0)) {
      lVar11 = (long)(this->player[-0xa3fb].weapons.Slots + 4) / 0x2a0;
      inflictor_local->player->frags[lVar11] = inflictor_local->player->frags[lVar11] + 1;
      if (this->player == inflictor_local->player) {
        this->player->fragcount = this->player->fragcount + -1;
        iVar5 = FIntCVar::operator_cast_to_int(&deathmatch);
        if (((iVar5 != 0) && (4 < this->player->spreecount)) &&
           (bVar3 = FBoolCVar::operator_cast_to_bool(&cl_showsprees), bVar3)) {
          pcVar13 = FStringTable::operator()(&GStrings,"SPREEKILLSELF");
          iVar5 = userinfo_t::GetGender(&this->player->userinfo);
          pcVar14 = userinfo_t::GetName(&this->player->userinfo);
          killer = userinfo_t::GetName(&this->player->userinfo);
          pcVar12 = local_198;
          SexMessage(pcVar13,local_198,iVar5,pcVar14,killer);
          pDVar2 = StatusBar;
          pDVar15 = (DHUDMessageFadeOut *)DObject::operator_new((DObject *)0xc8,(size_t)pcVar12);
          DHUDMessageFadeOut::DHUDMessageFadeOut
                    (pDVar15,SmallFont,local_198,1.5,0.2,0,0,CR_WHITE,3.0,0.5);
          DBaseStatusBar::AttachMessage(pDVar2,(DHUDMessage *)pDVar15,0x5250534b,0);
        }
      }
      else {
        uVar6 = FIntCVar::operator_cast_to_int(&dmflags2);
        if (((uVar6 & 0x8000) != 0) &&
           (iVar5 = FIntCVar::operator_cast_to_int(&deathmatch), iVar5 != 0)) {
          this->player->fragcount = this->player->fragcount + -1;
        }
        bVar3 = IsTeammate(this,inflictor_local);
        if (bVar3) {
          inflictor_local->player->fragcount = inflictor_local->player->fragcount + -1;
        }
        else {
          inflictor_local->player->fragcount = inflictor_local->player->fragcount + 1;
          inflictor_local->player->spreecount = inflictor_local->player->spreecount + '\x01';
        }
        if (inflictor_local->player->morphTics != 0) {
          GiveInventoryType(inflictor_local,
                            (PClassActor *)APowerWeaponLevel2::RegistrationInfo.MyClass);
        }
        iVar5 = FIntCVar::operator_cast_to_int(&deathmatch);
        if ((iVar5 != 0) && (bVar3 = FBoolCVar::operator_cast_to_bool(&cl_showsprees), bVar3)) {
          switch(inflictor_local->player->spreecount) {
          case '\x05':
            local_1b0 = FStringTable::operator()(&GStrings,"SPREE5");
            break;
          default:
            local_1b0 = (char *)0x0;
            break;
          case '\n':
            local_1b0 = FStringTable::operator()(&GStrings,"SPREE10");
            break;
          case '\x0f':
            local_1b0 = FStringTable::operator()(&GStrings,"SPREE15");
            break;
          case '\x14':
            local_1b0 = FStringTable::operator()(&GStrings,"SPREE20");
            break;
          case '\x19':
            local_1b0 = FStringTable::operator()(&GStrings,"SPREE25");
          }
          if ((local_1b0 == (char *)0x0) && (4 < this->player->spreecount)) {
            bVar3 = AnnounceSpreeLoss(this);
            if (!bVar3) {
              pcVar12 = FStringTable::operator()(&GStrings,"SPREEOVER");
              iVar5 = userinfo_t::GetGender(&this->player->userinfo);
              pcVar13 = userinfo_t::GetName(&this->player->userinfo);
              pcVar14 = userinfo_t::GetName(&inflictor_local->player->userinfo);
              ppcVar19 = &multimsg;
              SexMessage(pcVar12,(char *)&multimsg,iVar5,pcVar13,pcVar14);
              pDVar2 = StatusBar;
              pDVar15 = (DHUDMessageFadeOut *)
                        DObject::operator_new((DObject *)0xc8,(size_t)ppcVar19);
              DHUDMessageFadeOut::DHUDMessageFadeOut
                        (pDVar15,SmallFont,(char *)&multimsg,1.5,0.2,0,0,CR_WHITE,3.0,0.5);
              DBaseStatusBar::AttachMessage(pDVar2,(DHUDMessage *)pDVar15,0x5250534b,0);
            }
          }
          else if ((local_1b0 != (char *)0x0) && (bVar3 = AnnounceSpree(inflictor_local), !bVar3)) {
            iVar5 = userinfo_t::GetGender(&this->player->userinfo);
            pcVar12 = userinfo_t::GetName(&this->player->userinfo);
            pcVar13 = userinfo_t::GetName(&inflictor_local->player->userinfo);
            ppcVar19 = &multimsg;
            SexMessage(local_1b0,(char *)&multimsg,iVar5,pcVar12,pcVar13);
            pDVar2 = StatusBar;
            pDVar15 = (DHUDMessageFadeOut *)DObject::operator_new((DObject *)0xc8,(size_t)ppcVar19);
            DHUDMessageFadeOut::DHUDMessageFadeOut
                      (pDVar15,SmallFont,(char *)&multimsg,1.5,0.2,0,0,CR_WHITE,3.0,0.5);
            DBaseStatusBar::AttachMessage(pDVar2,(DHUDMessage *)pDVar15,0x5250534b,0);
          }
        }
      }
      if (this->player != inflictor_local->player) {
        inflictor_local->player->multicount = inflictor_local->player->multicount + '\x01';
        if (0 < inflictor_local->player->lastkilltime) {
          if (inflictor_local->player->lastkilltime < ::level.time + -0x69) {
            inflictor_local->player->multicount = '\x01';
          }
          iVar5 = FIntCVar::operator_cast_to_int(&deathmatch);
          if (((iVar5 != 0) && (bVar3 = CheckLocalView(inflictor_local,consoleplayer), bVar3)) &&
             (bVar3 = FBoolCVar::operator_cast_to_bool(&cl_showmultikills), bVar3)) {
            switch(inflictor_local->player->multicount) {
            case '\x01':
              local_2c0 = (char *)0x0;
              break;
            case '\x02':
              local_2c0 = FStringTable::operator()(&GStrings,"MULTI2");
              break;
            case '\x03':
              local_2c0 = FStringTable::operator()(&GStrings,"MULTI3");
              break;
            case '\x04':
              local_2c0 = FStringTable::operator()(&GStrings,"MULTI4");
              break;
            default:
              local_2c0 = FStringTable::operator()(&GStrings,"MULTI5");
            }
            if ((local_2c0 != (char *)0x0) && (bVar3 = AnnounceMultikill(inflictor_local), !bVar3))
            {
              iVar5 = userinfo_t::GetGender(&this->player->userinfo);
              pcVar13 = userinfo_t::GetName(&this->player->userinfo);
              pcVar14 = userinfo_t::GetName(&inflictor_local->player->userinfo);
              pcVar12 = local_3c8;
              SexMessage(local_2c0,local_3c8,iVar5,pcVar13,pcVar14);
              pDVar2 = StatusBar;
              pDVar15 = (DHUDMessageFadeOut *)DObject::operator_new((DObject *)0xc8,(size_t)pcVar12)
              ;
              DHUDMessageFadeOut::DHUDMessageFadeOut
                        (pDVar15,SmallFont,local_3c8,1.5,0.8,0,0,CR_RED,3.0,0.5);
              DBaseStatusBar::AttachMessage(pDVar2,(DHUDMessage *)pDVar15,0x4c494b4d,0);
            }
          }
        }
        inflictor_local->player->lastkilltime = ::level.time;
      }
      iVar5 = FIntCVar::operator_cast_to_int(&deathmatch);
      if ((iVar5 != 0) && (iVar5 = FIntCVar::operator_cast_to_int(&fraglimit), iVar5 != 0)) {
        iVar5 = FIntCVar::operator_cast_to_int(&fraglimit);
        iVar7 = D_GetFragCount(inflictor_local->player);
        if (iVar5 <= iVar7) {
          FStringTable::operator()(&GStrings,"TXT_FRAGLIMIT");
          Printf("%s\n");
          G_ExitLevel(0,false);
        }
      }
    }
  }
  if (this->player != (player_t *)0x0) {
    ClientObituary(this,pAStack_20,inflictor_local,realthis._4_4_);
    FBehavior::StaticStartTypedScripts(3,this,true,0,false);
    this->player->respawn_time = ::level.time + 0x23;
    if ((bglobal.botnum != 0) && ((demoplayback & 1U) == 0)) {
      bVar3 = TObjPtr<DBot>::operator!=(&this->player->Bot,(DBot *)0x0);
      if (bVar3) {
        iVar5 = FRandom::operator()(&pr_botrespawn);
        iVar7 = bglobal.botnum + -1;
        pDVar16 = TObjPtr<DBot>::operator->(&this->player->Bot);
        pDVar16->t_respawn = iVar5 % 0xf + iVar7 * 2 + 0x24;
      }
      for (local_3cc = 0; local_3cc < 8; local_3cc = local_3cc + 1) {
        bVar3 = TObjPtr<DBot>::operator!=
                          ((TObjPtr<DBot> *)(&DAT_01ae7258 + (long)local_3cc * 0x2a0),(DBot *)0x0);
        if (bVar3) {
          pDVar16 = TObjPtr<DBot>::operator->
                              ((TObjPtr<DBot> *)(&DAT_01ae7258 + (long)local_3cc * 0x2a0));
          pAVar17 = ::TObjPtr::operator_cast_to_AActor_((TObjPtr *)&pDVar16->enemy);
          if (this == pAVar17) {
            pDVar16 = TObjPtr<DBot>::operator->
                                ((TObjPtr<DBot> *)(&DAT_01ae7258 + (long)local_3cc * 0x2a0));
            pDVar18 = TObjPtr<DBot>::operator->
                                ((TObjPtr<DBot> *)(&DAT_01ae7258 + (long)local_3cc * 0x2a0));
            pAVar17 = ::TObjPtr::operator_cast_to_AActor_((TObjPtr *)&pDVar18->enemy);
            bVar3 = TObjPtr<AActor>::operator==(&pDVar16->dest,pAVar17);
            if (bVar3) {
              pDVar16 = TObjPtr<DBot>::operator->
                                  ((TObjPtr<DBot> *)(&DAT_01ae7258 + (long)local_3cc * 0x2a0));
              TObjPtr<AActor>::operator=(&pDVar16->dest,(AActor *)0x0);
            }
            pDVar16 = TObjPtr<DBot>::operator->
                                ((TObjPtr<DBot> *)(&DAT_01ae7258 + (long)local_3cc * 0x2a0));
            TObjPtr<AActor>::operator=(&pDVar16->enemy,(AActor *)0x0);
          }
        }
      }
      this->player->spreecount = '\0';
      this->player->multicount = '\0';
    }
    if (inflictor_local == (AActor *)0x0) {
      lVar11 = (long)(this->player[-0xa3fb].weapons.Slots + 4) / 0x2a0;
      this->player->frags[lVar11] = this->player->frags[lVar11] + 1;
      this->player->fragcount = this->player->fragcount + -1;
    }
    operator~((EnumType)&local_3d0);
    TFlags<ActorFlag,_unsigned_int>::operator&=(&this->flags,&local_3d0);
    this->player->playerstate = '\x01';
    P_DropWeapon(this->player);
    pAVar17 = ::TObjPtr::operator_cast_to_AActor_
                        ((TObjPtr *)(&DAT_01ae7238 + (long)consoleplayer * 0x2a0));
    if ((this == pAVar17) && ((automapactive & 1U) != 0)) {
      AM_Stop();
    }
    this->player->extralight = 0;
  }
  TFlags<ActorFlag,_unsigned_int>::operator&
            ((TFlags<ActorFlag,_unsigned_int> *)((long)&diestate + 4),
             iVar1 + (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|
                     MF_SHOOTABLE));
  uVar6 = ::TFlags::operator_cast_to_unsigned_int((TFlags *)((long)&diestate + 4));
  if (uVar6 != 0) {
    (*(this->super_DThinker).super_DObject._vptr_DObject[4])();
    return;
  }
  _iflags4 = (FState *)0x0;
  iStack_3e4 = GetGibHealth(this);
  if (pAStack_20 == (AActor *)0x0) {
    TFlags<ActorFlag4,_unsigned_int>::FromInt(&local_3e8,0);
  }
  else {
    TFlags<ActorFlag4,_unsigned_int>::TFlags(&local_3e8,&pAStack_20->flags4);
  }
  if (iStack_3e4 <= this->health) {
    TFlags<ActorFlag4,_unsigned_int>::operator&
              ((TFlags<ActorFlag4,_unsigned_int> *)(labels + 2),(ActorFlag4)&local_3e8);
    uVar6 = ::TFlags::operator_cast_to_unsigned_int((TFlags *)(labels + 2));
    bVar3 = false;
    if (uVar6 == 0) goto LAB_005661ff;
  }
  TFlags<ActorFlag4,_unsigned_int>::operator&
            ((TFlags<ActorFlag4,_unsigned_int> *)(labels + 1),(ActorFlag4)&local_3e8);
  uVar6 = ::TFlags::operator_cast_to_unsigned_int((TFlags *)(labels + 1));
  bVar3 = uVar6 == 0;
LAB_005661ff:
  bVar4 = FName::operator==(&(this->DamageType).super_FName,NAME_Extreme);
  if (bVar4) {
    bVar3 = true;
    FNameNoInit::operator=(&this->DamageType,NAME_None);
  }
  bVar4 = FName::operator!=(&(this->DamageType).super_FName,NAME_None);
  if (bVar4) {
    if (bVar3) {
      FName::FName(&local_400,NAME_Death);
      FName::FName(&FStack_3fc,NAME_Extreme);
      FName::FName(labels,&(this->DamageType).super_FName);
      _iflags4 = FindState(this,3,&local_400,true);
    }
    if (_iflags4 == (FState *)0x0) {
      FName::FName(&local_404,NAME_Death);
      FName::FName(&local_408,&(this->DamageType).super_FName);
      _iflags4 = FindState(this,&local_404,&local_408,true);
      if (_iflags4 != (FState *)0x0) {
        bVar3 = false;
      }
    }
    if ((_iflags4 == (FState *)0x0) &&
       (bVar4 = FName::operator==(&(this->DamageType).super_FName,NAME_Ice), bVar4)) {
      bVar4 = false;
      if (deh.NoAutofreeze == 0) {
        TFlags<ActorFlag4,_unsigned_int>::operator&
                  (&local_40c,
                   iVar1 + (MF4_STRIFEDAMAGE|MF4_ACTLIKEBRIDGE|MF4_FIXMAPTHINGPOS|MF4_BOSSDEATH));
        uVar6 = ::TFlags::operator_cast_to_unsigned_int((TFlags *)&local_40c);
        bVar4 = false;
        if ((uVar6 == 0) && (bVar4 = true, this->player == (player_t *)0x0)) {
          TFlags<ActorFlag3,_unsigned_int>::operator&
                    (&local_410,
                     iVar1 + (MF3_DONTOVERLAP|MF3_NOSIGHTCHECK|MF3_DONTSPLASH|MF3_NORADIUSDMG));
          uVar6 = ::TFlags::operator_cast_to_unsigned_int((TFlags *)&local_410);
          bVar4 = uVar6 != 0;
        }
      }
      if (bVar4) {
        FName::FName(&local_414,NAME_GenericFreezeDeath);
        _iflags4 = FindState(this,&local_414);
        bVar3 = false;
      }
    }
  }
  if (_iflags4 == (FState *)0x0) {
    bVar4 = FName::operator!=(&(this->DamageType).super_FName,NAME_Massacre);
    if (bVar4) {
      FNameNoInit::operator=(&this->DamageType,NAME_None);
    }
    if (bVar3) {
      FName::FName(&local_418,NAME_Death);
      FName::FName(&local_41c,NAME_Extreme);
      _iflags4 = FindState(this,&local_418,&local_41c,true);
    }
    if (_iflags4 == (FState *)0x0) {
      bVar3 = false;
      FName::FName(&local_420,NAME_Death);
      _iflags4 = FindState(this,&local_420);
    }
  }
  if (bVar3) {
    if (this->player == (player_t *)0x0) {
      if (iStack_3e4 <= this->health) {
        this->health = iStack_3e4 + -1;
      }
    }
    else {
      this->player->cheats = this->player->cheats | 0x400000;
    }
  }
  if (_iflags4 == (FState *)0x0) {
    (*(this->super_DThinker).super_DObject._vptr_DObject[4])();
  }
  else {
    SetState(this,_iflags4,false);
    if (1 < this->tics) {
      uVar6 = FRandom::operator()(&pr_killmobj);
      this->tics = this->tics - (uVar6 & 3);
      if (this->tics < 1) {
        this->tics = 1;
      }
    }
  }
  return;
}

Assistant:

void AActor::Die (AActor *source, AActor *inflictor, int dmgflags)
{
	// Handle possible unmorph on death
	bool wasgibbed = (health < GetGibHealth());
	AActor *realthis = NULL;
	int realstyle = 0;
	int realhealth = 0;
	if (P_MorphedDeath(this, &realthis, &realstyle, &realhealth))
	{
		if (!(realstyle & MORPH_UNDOBYDEATHSAVES))
		{
			if (wasgibbed)
			{
				int realgibhealth = realthis->GetGibHealth();
				if (realthis->health >= realgibhealth)
				{
					realthis->health = realgibhealth -1; // if morphed was gibbed, so must original be (where allowed)l
				}
			}
			realthis->CallDie(source, inflictor, dmgflags);
		}
		return;
	}

	// [SO] 9/2/02 -- It's rather funny to see an exploded player body with the invuln sparkle active :) 
	effects &= ~FX_RESPAWNINVUL;
	//flags &= ~MF_INVINCIBLE;

	if (debugfile && this->player)
	{
		static int dieticks[MAXPLAYERS]; // [ZzZombo] not used? Except if for peeking in debugger...
		int pnum = int(this->player-players);
		dieticks[pnum] = gametic;
		fprintf (debugfile, "died (%d) on tic %d (%s)\n", pnum, gametic,
		this->player->cheats&CF_PREDICTING?"predicting":"real");
	}

	// [RH] Notify this actor's items.
	for (AInventory *item = Inventory; item != NULL; )
	{
		AInventory *next = item->Inventory;
		item->OwnerDied();
		item = next;
	}

	if (flags & MF_MISSILE)
	{ // [RH] When missiles die, they just explode
		P_ExplodeMissile (this, NULL, NULL);
		return;
	}
	// [RH] Set the target to the thing that killed it. Strife apparently does this.
	if (source != NULL)
	{
		target = source;
	}

	// [JM] Fire KILL type scripts for actor. Not needed for players, since they have the "DEATH" script type.
	if (!player && !(flags7 & MF7_NOKILLSCRIPTS) && ((flags7 & MF7_USEKILLSCRIPTS) || gameinfo.forcekillscripts))
	{
		FBehavior::StaticStartTypedScripts(SCRIPT_Kill, this, true, 0, true);
	}

	flags &= ~(MF_SHOOTABLE|MF_FLOAT|MF_SKULLFLY);
	if (!(flags4 & MF4_DONTFALL)) flags&=~MF_NOGRAVITY;
	flags |= MF_DROPOFF;
	if ((flags3 & MF3_ISMONSTER) || FindState(NAME_Raise) != NULL || IsKindOf(RUNTIME_CLASS(APlayerPawn)))
	{	// [RH] Only monsters get to be corpses.
		// Objects with a raise state should get the flag as well so they can
		// be revived by an Arch-Vile. Batman Doom needs this.
		// [RC] And disable this if DONTCORPSE is set, of course.
		if(!(flags6 & MF6_DONTCORPSE)) flags |= MF_CORPSE;
	}
	flags6 |= MF6_KILLED;

	// [RH] Allow the death height to be overridden using metadata.
	double metaheight = -1;
	if (DamageType == NAME_Fire)
	{
		metaheight = GetClass()->BurnHeight;
	}
	if (metaheight < 0)
	{
		metaheight = GetClass()->DeathHeight;
	}
	if (metaheight < 0)
	{
		Height *= 0.25;
	}
	else
	{
		Height = MAX<double> (metaheight, 0);
	}

	// [RH] If the thing has a special, execute and remove it
	//		Note that the thing that killed it is considered
	//		the activator of the script.
	// New: In Hexen, the thing that died is the activator,
	//		so now a level flag selects who the activator gets to be.
	// Everything is now moved to P_ActivateThingSpecial().
	if (special && (!(flags & MF_SPECIAL) || (flags3 & MF3_ISMONSTER))
		&& !(activationtype & THINGSPEC_NoDeathSpecial))
	{
		P_ActivateThingSpecial(this, source, true); 
	}

	if (CountsAsKill())
		level.killed_monsters++;
		
	if (source && source->player)
	{
		if (CountsAsKill())
		{ // count for intermission
			source->player->killcount++;
		}

		// Don't count any frags at level start, because they're just telefrags
		// resulting from insufficient deathmatch starts, and it wouldn't be
		// fair to count them toward a player's score.
		if (player && level.maptime)
		{
			source->player->frags[player - players]++;
			if (player == source->player)	// [RH] Cumulative frag count
			{
				char buff[256];

				player->fragcount--;
				if (deathmatch && player->spreecount >= 5 && cl_showsprees)
				{
					SexMessage (GStrings("SPREEKILLSELF"), buff,
						player->userinfo.GetGender(), player->userinfo.GetName(),
						player->userinfo.GetName());
					StatusBar->AttachMessage (new DHUDMessageFadeOut (SmallFont, buff,
							1.5f, 0.2f, 0, 0, CR_WHITE, 3.f, 0.5f), MAKE_ID('K','S','P','R'));
				}
			}
			else
			{
				if ((dmflags2 & DF2_YES_LOSEFRAG) && deathmatch)
					player->fragcount--;

				if (this->IsTeammate(source))
				{
					source->player->fragcount--;
				}
				else
				{
					++source->player->fragcount;
					++source->player->spreecount;
				}

				if (source->player->morphTics)
				{ // Make a super chicken
					source->GiveInventoryType (RUNTIME_CLASS(APowerWeaponLevel2));
				}

				if (deathmatch && cl_showsprees)
				{
					const char *spreemsg;
					char buff[256];

					switch (source->player->spreecount)
					{
					case 5:
						spreemsg = GStrings("SPREE5");
						break;
					case 10:
						spreemsg = GStrings("SPREE10");
						break;
					case 15:
						spreemsg = GStrings("SPREE15");
						break;
					case 20:
						spreemsg = GStrings("SPREE20");
						break;
					case 25:
						spreemsg = GStrings("SPREE25");
						break;
					default:
						spreemsg = NULL;
						break;
					}

					if (spreemsg == NULL && player->spreecount >= 5)
					{
						if (!AnnounceSpreeLoss (this))
						{
							SexMessage (GStrings("SPREEOVER"), buff, player->userinfo.GetGender(),
								player->userinfo.GetName(), source->player->userinfo.GetName());
							StatusBar->AttachMessage (new DHUDMessageFadeOut (SmallFont, buff,
								1.5f, 0.2f, 0, 0, CR_WHITE, 3.f, 0.5f), MAKE_ID('K','S','P','R'));
						}
					}
					else if (spreemsg != NULL)
					{
						if (!AnnounceSpree (source))
						{
							SexMessage (spreemsg, buff, player->userinfo.GetGender(),
								player->userinfo.GetName(), source->player->userinfo.GetName());
							StatusBar->AttachMessage (new DHUDMessageFadeOut (SmallFont, buff,
								1.5f, 0.2f, 0, 0, CR_WHITE, 3.f, 0.5f), MAKE_ID('K','S','P','R'));
						}
					}
				}
			}

			// [RH] Multikills
			if (player != source->player)
			{
				source->player->multicount++;
				if (source->player->lastkilltime > 0)
				{
					if (source->player->lastkilltime < level.time - 3*TICRATE)
					{
						source->player->multicount = 1;
					}

					if (deathmatch &&
						source->CheckLocalView (consoleplayer) &&
						cl_showmultikills)
					{
						const char *multimsg;

						switch (source->player->multicount)
						{
						case 1:
							multimsg = NULL;
							break;
						case 2:
							multimsg = GStrings("MULTI2");
							break;
						case 3:
							multimsg = GStrings("MULTI3");
							break;
						case 4:
							multimsg = GStrings("MULTI4");
							break;
						default:
							multimsg = GStrings("MULTI5");
							break;
						}
						if (multimsg != NULL)
						{
							char buff[256];

							if (!AnnounceMultikill (source))
							{
								SexMessage (multimsg, buff, player->userinfo.GetGender(),
									player->userinfo.GetName(), source->player->userinfo.GetName());
								StatusBar->AttachMessage (new DHUDMessageFadeOut (SmallFont, buff,
									1.5f, 0.8f, 0, 0, CR_RED, 3.f, 0.5f), MAKE_ID('M','K','I','L'));
							}
						}
					}
				}
				source->player->lastkilltime = level.time;
			}

			// [RH] Implement fraglimit
			if (deathmatch && fraglimit &&
				fraglimit <= D_GetFragCount (source->player))
			{
				Printf ("%s\n", GStrings("TXT_FRAGLIMIT"));
				G_ExitLevel (0, false);
			}
		}
	}
	else if (!multiplayer && CountsAsKill())
	{
		// count all monster deaths,
		// even those caused by other monsters
		players[0].killcount++;
	}

	if (player)
	{
		// [RH] Death messages
		ClientObituary (this, inflictor, source, dmgflags);

		// Death script execution, care of Skull Tag
		FBehavior::StaticStartTypedScripts (SCRIPT_Death, this, true);

		// [RH] Force a delay between death and respawn
		player->respawn_time = level.time + TICRATE;

		//Added by MC: Respawn bots
		if (bglobal.botnum && !demoplayback)
		{
			if (player->Bot != NULL)
				player->Bot->t_respawn = (pr_botrespawn()%15)+((bglobal.botnum-1)*2)+TICRATE+1;

			//Added by MC: Discard enemies.
			for (int i = 0; i < MAXPLAYERS; i++)
			{
				if (players[i].Bot != NULL && this == players[i].Bot->enemy)
				{
					if (players[i].Bot->dest ==  players[i].Bot->enemy)
						players[i].Bot->dest = NULL;
					players[i].Bot->enemy = NULL;
				}
			}

			player->spreecount = 0;
			player->multicount = 0;
		}

		// count environment kills against you
		if (!source)
		{
			player->frags[player - players]++;
			player->fragcount--;	// [RH] Cumulative frag count
		}
						
		flags &= ~MF_SOLID;
		player->playerstate = PST_DEAD;
		P_DropWeapon (player);
		if (this == players[consoleplayer].camera && automapactive)
		{
			// don't die in auto map, switch view prior to dying
			AM_Stop ();
		}

		// [GRB] Clear extralight. When you killed yourself with weapon that
		// called A_Light1/2 before it called A_Light0, extraligh remained.
		player->extralight = 0;
	}

	// [RH] If this is the unmorphed version of another monster, destroy this
	// actor, because the morphed version is the one that will stick around in
	// the level.
	if (flags & MF_UNMORPHED)
	{
		Destroy ();
		return;
	}



	FState *diestate = NULL;
	int gibhealth = GetGibHealth();
	ActorFlags4 iflags4 = inflictor == NULL ? ActorFlags4::FromInt(0) : inflictor->flags4;
	bool extremelydead = ((health < gibhealth || iflags4 & MF4_EXTREMEDEATH) && !(iflags4 & MF4_NOEXTREMEDEATH));

	// Special check for 'extreme' damage type to ensure that it gets recorded properly as an extreme death for subsequent checks.
	if (DamageType == NAME_Extreme)
	{
		extremelydead = true;
		DamageType = NAME_None;
	}

	// find the appropriate death state. The order is:
	//
	// 1. If damagetype is not 'none' and death is extreme, try a damage type specific extreme death state
	// 2. If no such state is found or death is not extreme try a damage type specific normal death state
	// 3. If damagetype is 'ice' and actor is a monster or player, try the generic freeze death (unless prohibited)
	// 4. If no state has been found and death is extreme, try the extreme death state
	// 5. If no such state is found or death is not extreme try the regular death state.
	// 6. If still no state has been found, destroy the actor immediately.

	if (DamageType != NAME_None)
	{
		if (extremelydead)
		{
			FName labels[] = { NAME_Death, NAME_Extreme, DamageType };
			diestate = FindState(3, labels, true);
		}
		if (diestate == NULL)
		{
			diestate = FindState (NAME_Death, DamageType, true);
			if (diestate != NULL) extremelydead = false;
		}
		if (diestate == NULL)
		{
			if (DamageType == NAME_Ice)
			{ // If an actor doesn't have an ice death, we can still give them a generic one.

				if (!deh.NoAutofreeze && !(flags4 & MF4_NOICEDEATH) && (player || (flags3 & MF3_ISMONSTER)))
				{
					diestate = FindState(NAME_GenericFreezeDeath);
					extremelydead = false;
				}
			}
		}
	}
	if (diestate == NULL)
	{
		
		// Don't pass on a damage type this actor cannot handle.
		// (most importantly, prevent barrels from passing on ice damage.)
		// Massacre must be preserved though.
		if (DamageType != NAME_Massacre)
		{
			DamageType = NAME_None;	
		}

		if (extremelydead)
		{ // Extreme death
			diestate = FindState (NAME_Death, NAME_Extreme, true);
		}
		if (diestate == NULL)
		{ // Normal death
			extremelydead = false;
			diestate = FindState (NAME_Death);
		}
	}

	if (extremelydead)
	{ 
		// We'll only get here if an actual extreme death state was used.

		// For players, mark the appropriate flag.
		if (player != NULL)
		{
			player->cheats |= CF_EXTREMELYDEAD;
		}
		// If a non-player, mark as extremely dead for the crash state.
		else if (health >= gibhealth)
		{
			health = gibhealth - 1;
		}
	}

	if (diestate != NULL)
	{
		SetState (diestate);

		if (tics > 1)
		{
			tics -= pr_killmobj() & 3;
			if (tics < 1)
				tics = 1;
		}
	}
	else
	{
		Destroy();
	}
}